

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O0

int fetch_all_fare_rules_db(feed_db_t *db,fare_rule_t **records)

{
  int iVar1;
  void *pvVar2;
  uchar *puVar3;
  char local_1d8 [8];
  char qr [84];
  sqlite3_stmt *local_178;
  sqlite3_stmt *stmt;
  int local_168;
  int i;
  int record_count;
  feed_db_status_t res;
  fare_rule_t record;
  fare_rule_t **records_local;
  feed_db_t *db_local;
  
  record.contains_id._56_8_ = records;
  local_168 = count_rows_db(db,"fare_rules");
  stmt._4_4_ = 0;
  db_local._4_4_ = local_168;
  if (0 < local_168) {
    memcpy(local_1d8,
           "SELECT fare_id, route_id, origin_id, destination_id, contains_id FROM `fare_rules`;",
           0x54);
    sqlite3_prepare_v2(db->conn,local_1d8,-1,&local_178,(char **)0x0);
    pvVar2 = malloc((long)local_168 * 0x140);
    *(void **)record.contains_id._56_8_ = pvVar2;
    if (*(long *)record.contains_id._56_8_ == 0) {
      sqlite3_finalize(local_178);
      db_local._4_4_ = -1;
    }
    else {
      do {
        iVar1 = sqlite3_step(local_178);
        db->rc = iVar1;
        if (iVar1 != 100) break;
        init_fare_rule((fare_rule_t *)&record_count);
        puVar3 = sqlite3_column_text(local_178,0);
        strcpy((char *)&record_count,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_178,1);
        strcpy(record.fare_id + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_178,2);
        strcpy(record.route_id + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_178,3);
        strcpy(record.origin_id + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_178,4);
        strcpy(record.destination_id + 0x38,(char *)puVar3);
        memcpy((void *)(*(long *)record.contains_id._56_8_ + (long)stmt._4_4_ * 0x140),&record_count
               ,0x140);
        stmt._4_4_ = stmt._4_4_ + 1;
      } while (stmt._4_4_ < local_168);
      sqlite3_finalize(local_178);
      db_local._4_4_ = local_168;
    }
  }
  return db_local._4_4_;
}

Assistant:

int fetch_all_fare_rules_db(feed_db_t *db, fare_rule_t **records) {

    fare_rule_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "fare_rules");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "fare_id, route_id, origin_id, destination_id, contains_id "
                "FROM `fare_rules`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_fare_rule(&record);

        strcpy(record.fare_id, sqlite3_column_text(stmt, 0));
        strcpy(record.route_id, sqlite3_column_text(stmt, 1));
        strcpy(record.origin_id, sqlite3_column_text(stmt, 2));
        strcpy(record.destination_id, sqlite3_column_text(stmt, 3));
        strcpy(record.contains_id, sqlite3_column_text(stmt, 4));

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}